

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ParseJSON2(JSContext *ctx,char *buf,size_t buf_len,char *filename,int flags)

{
  int iVar1;
  JSValue v;
  JSParseState s1;
  JSParseState local_a8;
  
  local_a8.last_ptr = (uint8_t *)0x0;
  local_a8.cur_func = (JSFunctionDef *)0x0;
  local_a8.is_module = 0;
  local_a8.allow_html_comments = 0;
  local_a8.token.u.regexp.flags.tag = 0;
  local_a8.got_lf = 0;
  local_a8._76_4_ = 0;
  local_a8.token.u.str.str.tag = 0;
  local_a8.token.u.regexp.flags.u = (JSValueUnion)0x0;
  local_a8.token.ptr = (uint8_t *)0x0;
  local_a8.token.u.str.str.u = (JSValueUnion)0x0;
  local_a8.last_line_num = 0;
  local_a8.line_num = 1;
  local_a8.buf_end = (uint8_t *)(buf + buf_len);
  local_a8.token.val = 0x20;
  local_a8.token.line_num = 1;
  local_a8._120_8_ = (ulong)(uint)flags & 0xffffffff00000001;
  local_a8.ctx = ctx;
  local_a8.filename = filename;
  local_a8.buf_ptr = (uint8_t *)buf;
  iVar1 = json_next_token(&local_a8);
  if (iVar1 == 0) {
    v = json_parse_value(&local_a8);
    if ((int)v.tag != 6) {
      if (local_a8.token.val == -0x56) {
        return v;
      }
      js_parse_error(&local_a8,"unexpected data at the end");
    }
  }
  else {
    v = (JSValue)(ZEXT816(3) << 0x40);
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  free_token(&local_a8,&local_a8.token);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

JSValue JS_ParseJSON2(JSContext *ctx, const char *buf, size_t buf_len,
                      const char *filename, int flags)
{
    JSParseState s1, *s = &s1;
    JSValue val = JS_UNDEFINED;

    js_parse_init(ctx, s, buf, buf_len, filename);
    s->ext_json = ((flags & JS_PARSE_JSON_EXT) != 0);
    if (json_next_token(s))
        goto fail;
    val = json_parse_value(s);
    if (JS_IsException(val))
        goto fail;
    if (s->token.val != TOK_EOF) {
        if (js_parse_error(s, "unexpected data at the end"))
            goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    free_token(s, &s->token);
    return JS_EXCEPTION;
}